

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameTableTest(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  u64 uVar1;
  sqlite3_xauth p_Var2;
  ulong uVar3;
  Schema *pSVar4;
  Mem *pMem;
  int iVar5;
  int iVar6;
  char *zDb;
  char *zSql;
  i64 iVar7;
  char *zWhen;
  i64 iVar8;
  Schema **ppSVar9;
  bool bVar10;
  uint uVar11;
  Parse sParse;
  NameContext sNC;
  Parse local_208;
  NameContext local_68;
  
  db = context->pOut->db;
  zDb = (char *)sqlite3ValueText(*argv,'\x01');
  zSql = (char *)sqlite3ValueText(argv[1],'\x01');
  iVar7 = sqlite3VdbeIntValue(argv[4]);
  uVar1 = db->flags;
  zWhen = (char *)sqlite3ValueText(argv[5],'\x01');
  iVar8 = sqlite3VdbeIntValue(argv[6]);
  p_Var2 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  if (zSql == (char *)0x0 || zDb == (char *)0x0) goto LAB_001b973c;
  uVar3 = db->flags;
  if ((int)iVar8 != 0) {
    db->flags = uVar3 & 0xffffffff9fffffff;
  }
  iVar5 = renameParseSql(&local_208,zDb,db,zSql,(int)iVar7);
  db->flags = db->flags | (ulong)((uint)uVar3 & 0x60000000);
  bVar10 = true;
  if (iVar5 == 0) {
    uVar11 = (uint)uVar1;
    if ((local_208.pNewTable == (Table *)0x0 || (uVar11 >> 0x1a & 1) != 0) ||
       ((local_208.pNewTable)->eTabType != '\x02')) {
      if (local_208.pNewTrigger != (Trigger *)0x0) {
        if (((uVar11 >> 0x1a & 1) == 0) && (iVar5 = renameResolveTrigger(&local_208), iVar5 != 0))
        goto LAB_001b96fb;
        if ((local_208.pNewTrigger)->pTabSchema == (Schema *)0x0) {
          iVar5 = -0x8000;
        }
        else {
          iVar5 = -1;
          ppSVar9 = &db->aDb->pSchema;
          do {
            iVar5 = iVar5 + 1;
            pSVar4 = *ppSVar9;
            ppSVar9 = ppSVar9 + 4;
          } while (pSVar4 != (local_208.pNewTrigger)->pTabSchema);
        }
        iVar6 = sqlite3FindDbName(db,zDb);
        if (iVar5 == iVar6) {
          pMem = context->pOut;
          if ((pMem->flags & 0x9000) == 0) {
            (pMem->u).r = 4.94065645841247e-324;
            pMem->flags = 4;
          }
          else {
            vdbeReleaseAndSetInt64(pMem,1);
          }
        }
      }
      bVar10 = false;
    }
    else {
      local_68.pSrcList = (SrcList *)0x0;
      local_68.nRef = 0;
      local_68.nNcErr = 0;
      local_68.ncFlags = 0;
      local_68._44_4_ = 0;
      local_68.uNC.pEList = (ExprList *)0x0;
      local_68.pNext = (NameContext *)0x0;
      local_68.pWinSelect = (Select *)0x0;
      local_68.pParse = &local_208;
      sqlite3SelectPrep(&local_208,((local_208.pNewTable)->u).view.pSelect,&local_68);
      bVar10 = local_208.rc != 0 && local_208.nErr != 0;
    }
  }
LAB_001b96fb:
  if (((bool)(zWhen != (char *)0x0 & bVar10)) && ((db->flags & 0x10000001) != 1)) {
    renameColumnParseError(context,zWhen,argv[2],argv[3],&local_208);
  }
  renameParseCleanup(&local_208);
LAB_001b973c:
  db->xAuth = p_Var2;
  return;
}

Assistant:

static void renameTableTest(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);
  int bTemp = sqlite3_value_int(argv[4]);
  int isLegacy = (db->flags & SQLITE_LegacyAlter);
  char const *zWhen = (const char*)sqlite3_value_text(argv[5]);
  int bNoDQS = sqlite3_value_int(argv[6]);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);

  if( zDb && zInput ){
    int rc;
    Parse sParse;
    int flags = db->flags;
    if( bNoDQS ) db->flags &= ~(SQLITE_DqsDML|SQLITE_DqsDDL);
    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);
    db->flags |= (flags & (SQLITE_DqsDML|SQLITE_DqsDDL));
    if( rc==SQLITE_OK ){
      if( isLegacy==0 && sParse.pNewTable && IsView(sParse.pNewTable) ){
        NameContext sNC;
        memset(&sNC, 0, sizeof(sNC));
        sNC.pParse = &sParse;
        sqlite3SelectPrep(&sParse, sParse.pNewTable->u.view.pSelect, &sNC);
        if( sParse.nErr ) rc = sParse.rc;
      }

      else if( sParse.pNewTrigger ){
        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
        }
        if( rc==SQLITE_OK ){
          int i1 = sqlite3SchemaToIndex(db, sParse.pNewTrigger->pTabSchema);
          int i2 = sqlite3FindDbName(db, zDb);
          if( i1==i2 ){
            /* Handle output case B */
            sqlite3_result_int(context, 1);
          }
        }
      }
    }

    if( rc!=SQLITE_OK && zWhen && !sqlite3WritableSchema(db) ){
      /* Output case A */
      renameColumnParseError(context, zWhen, argv[2], argv[3],&sParse);
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
}